

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O3

int Fra_ClausCollectLatchClauses(Clu_Man_t *p,Fra_Sml_t *pSeq)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pObj1;
  Aig_Obj_t *pObj2;
  int iVar3;
  int *piVar4;
  Aig_Man_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  int iVar7;
  uint uVar8;
  Vec_Int_t *p_00;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong local_80;
  
  iVar1 = p->nSimWords;
  pSeq->nWordsPref = p->nSimWordsPref;
  pAVar5 = p->pAig;
  uVar12 = pAVar5->nObjs[2] - pAVar5->nRegs;
  pVVar6 = pAVar5->vCis;
  iVar7 = pVVar6->nSize;
  uVar8 = 0;
  uVar10 = 0;
  if (iVar7 <= (int)uVar12) {
LAB_00692ab5:
    pSeq->nWordsPref = 0;
    if (p->fVerbose != 0) {
      printf("Collected %d register constants and %d one-hotness implications.\n",(ulong)uVar8,
             (ulong)uVar10);
    }
    p->nOneHots = uVar10 + uVar8;
    p->nOneHotsProven = 0;
    return 0;
  }
  iVar1 = iVar1 << 5;
  local_80 = (ulong)uVar12;
  uVar10 = 0;
  uVar8 = 0;
LAB_006927f5:
  if ((int)uVar12 < 0) {
LAB_00692afb:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pObj1 = (Aig_Obj_t *)pVVar6->pArray[local_80];
  iVar2 = pSeq->nWordsTotal;
  iVar3 = pSeq->nWordsPref;
  if (iVar3 < iVar2) {
    lVar9 = 0;
    do {
      if (*(int *)((long)&pSeq[1].pAig + lVar9 * 4 + (long)(iVar2 * pObj1->Id) * 4 + (long)iVar3 * 4
                  ) != 0) {
        uVar11 = pAVar5->nObjs[2] - pAVar5->nRegs;
        if (iVar7 <= (int)uVar11) goto LAB_00692a76;
        uVar13 = (ulong)uVar11;
        goto LAB_006928b4;
      }
      lVar9 = lVar9 + 1;
    } while (iVar2 - iVar3 != (int)lVar9);
  }
  Vec_IntPush(p->vLits,p->pCnf->pVarNums[pObj1->Id] * 2 + 1);
  Vec_IntPush(p->vClauses,p->vLits->nSize);
  Vec_IntPush(p->vCosts,iVar1);
  uVar8 = uVar8 + 1;
  pAVar5 = p->pAig;
  goto LAB_00692a99;
LAB_006928b4:
  do {
    if ((int)uVar11 < 0) goto LAB_00692afb;
    pObj2 = (Aig_Obj_t *)pVVar6->pArray[uVar13];
    iVar7 = pObj2->Id;
    iVar2 = pSeq->nWordsTotal;
    iVar3 = Fra_ClausSmlNodesAreImp(pSeq,pObj1,pObj2);
    if (iVar3 == 0) {
      iVar3 = Fra_ClausSmlNodesAreImp(pSeq,pObj2,pObj1);
      if (iVar3 != 0) {
        Vec_IntPush(p->vLits,p->pCnf->pVarNums[iVar7] * 2 + 1);
        p_00 = p->vLits;
        piVar4 = p->pCnf->pVarNums;
        iVar7 = pObj1->Id;
        goto LAB_00692971;
      }
      iVar3 = pSeq->nWordsPref;
      if (iVar3 < iVar2) {
        lVar9 = 0;
        do {
          if ((*(uint *)((long)&pSeq[1].pAig +
                        lVar9 * 4 + (long)(pObj1->Id * iVar2) * 4 + (long)iVar3 * 4) &
              *(uint *)((long)&pSeq[1].pAig +
                       lVar9 * 4 + (long)(iVar7 * iVar2) * 4 + (long)iVar3 * 4)) != 0)
          goto LAB_006929b1;
          lVar9 = lVar9 + 1;
        } while (iVar2 - iVar3 != (int)lVar9);
      }
      Vec_IntPush(p->vLits,p->pCnf->pVarNums[pObj1->Id] * 2 + 1);
      Vec_IntPush(p->vLits,p->pCnf->pVarNums[pObj2->Id] * 2 + 1);
    }
    else {
      Vec_IntPush(p->vLits,p->pCnf->pVarNums[pObj1->Id] * 2 + 1);
      p_00 = p->vLits;
      piVar4 = p->pCnf->pVarNums;
      iVar7 = pObj2->Id;
LAB_00692971:
      Vec_IntPush(p_00,piVar4[iVar7] * 2);
    }
    Vec_IntPush(p->vClauses,p->vLits->nSize);
    Vec_IntPush(p->vCosts,iVar1);
    uVar10 = uVar10 + 1;
LAB_006929b1:
    uVar13 = uVar13 + 1;
    pAVar5 = p->pAig;
    pVVar6 = pAVar5->vCis;
  } while ((int)uVar13 < pVVar6->nSize);
LAB_00692a76:
  if (p->nClausesMax / 2 < (int)(uVar8 + uVar10)) goto LAB_00692ab5;
LAB_00692a99:
  local_80 = local_80 + 1;
  pVVar6 = pAVar5->vCis;
  iVar7 = pVVar6->nSize;
  if (iVar7 <= (int)local_80) goto LAB_00692ab5;
  goto LAB_006927f5;
}

Assistant:

int Fra_ClausCollectLatchClauses( Clu_Man_t * p, Fra_Sml_t * pSeq )
{
    Aig_Obj_t * pObj1, * pObj2;
    unsigned * pSims1, * pSims2;
    int CostMax, i, k, nCountConst, nCountImps;

    nCountConst = nCountImps = 0;
    CostMax = p->nSimWords * 32;
/*
    // add the property
    {
        Aig_Obj_t * pObj;
        int Lits[1];
        pObj = Aig_ManCo( p->pAig, 0 );
        Lits[0] = toLitCond( p->pCnf->pVarNums[pObj->Id], 1 ); 
        Vec_IntPush( p->vLits, Lits[0] );
        Vec_IntPush( p->vClauses, Vec_IntSize(p->vLits) );
        Vec_IntPush( p->vCosts, CostMax );
        nCountConst++;
//        printf( "Added the target property to the set of clauses to be inductively checked.\n" );
    }
*/

    pSeq->nWordsPref = p->nSimWordsPref;
    Aig_ManForEachLoSeq( p->pAig, pObj1, i )
    {
        pSims1 = Fra_ObjSim( pSeq, pObj1->Id );
        if ( Fra_ClausSmlNodeIsConst( pSeq, pObj1 ) )
        {
            Vec_IntPush( p->vLits, toLitCond( p->pCnf->pVarNums[pObj1->Id], 1 ) );
            Vec_IntPush( p->vClauses, Vec_IntSize(p->vLits) );
            Vec_IntPush( p->vCosts, CostMax );
            nCountConst++;
            continue;
        }
        Aig_ManForEachLoSeq( p->pAig, pObj2, k )
        {
            pSims2 = Fra_ObjSim( pSeq, pObj2->Id );
            if ( Fra_ClausSmlNodesAreImp( pSeq, pObj1, pObj2 ) )
            {
                Vec_IntPush( p->vLits, toLitCond( p->pCnf->pVarNums[pObj1->Id], 1 ) );
                Vec_IntPush( p->vLits, toLitCond( p->pCnf->pVarNums[pObj2->Id], 0 ) );
                Vec_IntPush( p->vClauses, Vec_IntSize(p->vLits) );
                Vec_IntPush( p->vCosts, CostMax );
                nCountImps++;
                continue;
            }
            if ( Fra_ClausSmlNodesAreImp( pSeq, pObj2, pObj1 ) )
            {
                Vec_IntPush( p->vLits, toLitCond( p->pCnf->pVarNums[pObj2->Id], 1 ) );
                Vec_IntPush( p->vLits, toLitCond( p->pCnf->pVarNums[pObj1->Id], 0 ) );
                Vec_IntPush( p->vClauses, Vec_IntSize(p->vLits) );
                Vec_IntPush( p->vCosts, CostMax );
                nCountImps++;
                continue;
            }
            if ( Fra_ClausSmlNodesAreImpC( pSeq, pObj1, pObj2 ) )
            {
                Vec_IntPush( p->vLits, toLitCond( p->pCnf->pVarNums[pObj1->Id], 1 ) );
                Vec_IntPush( p->vLits, toLitCond( p->pCnf->pVarNums[pObj2->Id], 1 ) );
                Vec_IntPush( p->vClauses, Vec_IntSize(p->vLits) );
                Vec_IntPush( p->vCosts, CostMax );
                nCountImps++;
                continue;
            }
        }
        if ( nCountConst + nCountImps > p->nClausesMax / 2 )
            break;
    }
    pSeq->nWordsPref = 0;
    if ( p->fVerbose )
    printf( "Collected %d register constants and %d one-hotness implications.\n", nCountConst, nCountImps );
    p->nOneHots = nCountConst + nCountImps;
    p->nOneHotsProven = 0;
    return 0;
}